

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook_x86.c
# Opt level: O2

int handle_rip_relative(make_trampoline_context_t *ctx,rip_relative_t *rel,size_t insn_size)

{
  uint uVar1;
  uint8_t *puVar2;
  ip_displacement_t *piVar3;
  uint8_t *puVar4;
  int iVar5;
  
  iVar5 = rel->size;
  if (iVar5 != 0) {
    if (iVar5 == 0x20) {
      puVar2 = ctx->dst;
      uVar1 = rel->offset;
      if (*(int *)(puVar2 + (int)uVar1) == (int)rel->raddr) {
        piVar3 = ctx->rip_disp;
        piVar3->disp[1].dst_addr = rel->addr;
        puVar4 = ctx->dst_base;
        piVar3->disp[1].src_addr_offset = (intptr_t)(puVar2 + (insn_size - (long)puVar4));
        piVar3->disp[1].pos_offset = (intptr_t)(puVar2 + ((long)(int)uVar1 - (long)puVar4));
        iVar5 = 0;
      }
      else {
        funchook_set_error_message
                  (ctx->funchook,
                   "Invalid ip-relative offset %d. The value at the offset should be %08x but %08x",
                   (ulong)uVar1);
        iVar5 = 4;
      }
    }
    else {
      funchook_set_error_message
                (ctx->funchook,"Could not fix ip-relative address. The size is not 32.");
      iVar5 = 5;
    }
  }
  return iVar5;
}

Assistant:

static int handle_rip_relative(make_trampoline_context_t *ctx, const rip_relative_t *rel, size_t insn_size)
{
    if (rel->size == 32) {
        if (*(int32_t*)(ctx->dst + rel->offset) != (uint32_t)rel->raddr) {
            /* sanity check.
             * reach here if opsiz and/or disp_offset are incorrectly
             * estimated.
             */
            funchook_set_error_message(ctx->funchook, "Invalid ip-relative offset %d. The value at the offset should be %08x but %08x",
                         rel->offset, (uint32_t)rel->raddr, *(int32_t*)(ctx->dst + rel->offset));
            return FUNCHOOK_ERROR_IP_RELATIVE_OFFSET;
        }
        ctx->rip_disp->disp[1].dst_addr = rel->addr;
        ctx->rip_disp->disp[1].src_addr_offset = (ctx->dst - ctx->dst_base) + insn_size;
        ctx->rip_disp->disp[1].pos_offset = (ctx->dst - ctx->dst_base) + rel->offset;
    } else if (rel->size != 0) {
        funchook_set_error_message(ctx->funchook, "Could not fix ip-relative address. The size is not 32.");
        return FUNCHOOK_ERROR_CANNOT_FIX_IP_RELATIVE;
    }
    return 0;
}